

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

VoidPromiseAndPipeline * __thiscall
capnp::LocalCallContext::directTailCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalCallContext *this,
          Own<capnp::RequestHook> *request)

{
  bool bVar1;
  RequestHook *pRVar2;
  Promise<void> *pPVar3;
  RemotePromise<capnp::AnyPointer> *pipeline;
  LocalCallContext *local_88;
  undefined1 local_80 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_capnp::Response<capnp::AnyPointer>_>
  voidPromise;
  RemotePromise<capnp::AnyPointer> promise;
  Fault local_28;
  Fault f;
  Own<capnp::RequestHook> *request_local;
  LocalCallContext *this_local;
  
  f.exception = (Exception *)request;
  bVar1 = kj::Maybe<capnp::Response<capnp::AnyPointer>_>::operator==(&this->response,(void *)0x0);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
               ,0x98,FAILED,"response == nullptr",
               "\"Can\'t call tailCall() after initializing the results struct.\"",
               (char (*) [61])"Can\'t call tailCall() after initializing the results struct.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  pRVar2 = kj::Own<capnp::RequestHook>::operator->((Own<capnp::RequestHook> *)f.exception);
  (**pRVar2->_vptr_RequestHook)();
  local_88 = this;
  kj::Promise<capnp::Response<capnp::AnyPointer>>::
  then<capnp::LocalCallContext::directTailCall(kj::Own<capnp::RequestHook>&&)::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::Response<capnp::AnyPointer>> *)local_80,
             (Type *)&voidPromise.super_PromiseBase.node.ptr,(PropagateException *)&local_88);
  pPVar3 = kj::mv<kj::Promise<void>>((Promise<void> *)local_80);
  kj::Promise<void>::Promise(&__return_storage_ptr__->promise,pPVar3);
  pipeline = kj::mv<capnp::RemotePromise<capnp::AnyPointer>>
                       ((RemotePromise<capnp::AnyPointer> *)&voidPromise.super_PromiseBase.node.ptr)
  ;
  PipelineHook::from<capnp::RemotePromise<capnp::AnyPointer>,capnp::AnyPointer>
            ((PipelineHook *)&__return_storage_ptr__->pipeline,pipeline);
  kj::Promise<void>::~Promise((Promise<void> *)local_80);
  RemotePromise<capnp::AnyPointer>::~RemotePromise
            ((RemotePromise<capnp::AnyPointer> *)&voidPromise.super_PromiseBase.node.ptr);
  return __return_storage_ptr__;
}

Assistant:

ClientHook::VoidPromiseAndPipeline directTailCall(kj::Own<RequestHook>&& request) override {
    KJ_REQUIRE(response == nullptr, "Can't call tailCall() after initializing the results struct.");

    auto promise = request->send();

    auto voidPromise = promise.then([this](Response<AnyPointer>&& tailResponse) {
      response = kj::mv(tailResponse);
    });

    return { kj::mv(voidPromise), PipelineHook::from(kj::mv(promise)) };
  }